

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

String * __thiscall Time::toString(String *__return_storage_ptr__,Time *this,char *format)

{
  usize copyLength;
  ulong copyLength_00;
  Data *pDVar1;
  size_t sVar2;
  ulong minCapacity;
  tm tm;
  tm local_50;
  
  if (*format == '\0') {
    __return_storage_ptr__->data = &String::emptyData.super_Data;
  }
  else {
    local_50.tm_sec = this->sec;
    local_50.tm_min = this->min;
    local_50.tm_hour = this->hour;
    local_50.tm_mday = this->day;
    local_50.tm_mon = this->month + -1;
    local_50.tm_year = this->year + -0x76c;
    local_50.tm_wday = this->wday;
    local_50.tm_yday = this->yday;
    local_50.tm_isdst = (int)this->dst;
    pDVar1 = (Data *)operator_new__(0x121);
    __return_storage_ptr__->data = pDVar1;
    pDVar1->str = (char *)(pDVar1 + 1);
    *(undefined1 *)&pDVar1[1].str = 0;
    pDVar1->len = 0;
    pDVar1->ref = 1;
    pDVar1->capacity = 0x100;
    while( true ) {
      copyLength = __return_storage_ptr__->data->len;
      String::detach(__return_storage_ptr__,copyLength,copyLength);
      pDVar1 = __return_storage_ptr__->data;
      if (pDVar1->ref == 1) {
        sVar2 = pDVar1->capacity;
      }
      else {
        sVar2 = 0;
      }
      sVar2 = strftime(pDVar1->str,sVar2,format,&local_50);
      if (sVar2 != 0) break;
      pDVar1 = __return_storage_ptr__->data;
      if (pDVar1->ref == 1) {
        minCapacity = pDVar1->capacity * 2;
      }
      else {
        minCapacity = 0;
      }
      copyLength_00 = pDVar1->len;
      if (minCapacity < copyLength_00) {
        minCapacity = copyLength_00;
      }
      String::detach(__return_storage_ptr__,copyLength_00,minCapacity);
    }
    String::detach(__return_storage_ptr__,sVar2,sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

String Time::toString(const char* format)
{
  if(!*format)
    return String();
  tm tm;
  tm.tm_sec = sec;
  tm.tm_min = min;
  tm.tm_hour = hour;
  tm.tm_mday = day;
  tm.tm_mon = month - 1;
  tm.tm_year = year - 1900;
  tm.tm_wday = wday;
  tm.tm_yday = yday;
  tm.tm_isdst = dst;

  String result(256);
  char* buffer;
  usize len;
  for(;;)
  {
    buffer = result;
    len = strftime(buffer, result.capacity(), format, &tm);
    if(len > 0)
      break;
    result.reserve(result.capacity() * 2);
  }
  result.resize(len);
  return result;
}